

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O1

SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
absl::lts_20250127::strings_internal::
SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator++(SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string_view sVar5;
  
  if (this->state_ == kLastState) {
    this->state_ = kEndState;
  }
  else {
    pcVar1 = (this->splitter_->text_)._M_dataplus._M_p;
    uVar2 = (this->splitter_->text_)._M_string_length;
    sVar5._M_str = pcVar1;
    sVar5._M_len = uVar2;
    sVar5 = ByChar::Find(&this->delimiter_,sVar5,this->pos_);
    if (sVar5._M_str == pcVar1 + uVar2) {
      this->state_ = kLastState;
    }
    uVar3 = this->pos_;
    if (uVar2 < uVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar3,uVar2);
    }
    uVar4 = (long)sVar5._M_str - (long)(pcVar1 + uVar3);
    if (uVar2 - uVar3 < uVar4) {
      uVar4 = uVar2 - uVar3;
    }
    (this->curr_)._M_len = uVar4;
    (this->curr_)._M_str = pcVar1 + uVar3;
    this->pos_ = sVar5._M_len + uVar3 + uVar4;
  }
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }